

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

ValueNode * __thiscall DL::Parser::gr_value(Parser *this)

{
  Lexer *this_00;
  SourceLogger *pSVar1;
  bool bVar2;
  line_t lVar3;
  column_t cVar4;
  ValueNode *pVVar5;
  StatementNode *pSVar6;
  ExpressionNode *pEVar7;
  ostream *poVar8;
  char *pcVar9;
  string *this_01;
  Token str;
  undefined1 local_2f0 [40];
  undefined1 local_2c8 [40];
  undefined1 local_2a0 [40];
  undefined1 local_278 [40];
  undefined1 local_250 [40];
  undefined1 local_228 [40];
  undefined1 local_200 [40];
  undefined1 local_1d8 [40];
  Token str_2;
  
  pVVar5 = (ValueNode *)operator_new(0x30);
  (pVVar5->_String)._M_dataplus._M_p = (pointer)&(pVVar5->_String).field_2;
  (pVVar5->_String)._M_string_length = 0;
  (pVVar5->_String).field_2._M_local_buf[0] = '\0';
  bVar2 = lookahead(this,T_OpenParanthese);
  if (bVar2) {
    match((Token *)local_1d8,this,T_OpenParanthese);
    std::__cxx11::string::~string((string *)(local_1d8 + 8));
    pVVar5->Type = VNT_Statement;
    pSVar6 = gr_statement(this);
    (pVVar5->field_1)._Statement = pSVar6;
    match((Token *)local_200,this,T_CloseParanthese);
    this_01 = (string *)(local_200 + 8);
  }
  else {
    bVar2 = lookahead(this,T_OpenSquareBracket);
    if (bVar2) {
      match((Token *)local_228,this,T_OpenSquareBracket);
      std::__cxx11::string::~string((string *)(local_228 + 8));
      pVVar5->Type = VNT_Statement;
      pSVar6 = gr_array(this);
      (pVVar5->field_1)._Statement = pSVar6;
      match((Token *)local_250,this,T_CloseSquareBracket);
      this_01 = (string *)(local_250 + 8);
    }
    else {
      bVar2 = lookahead(this,T_ExpressionParanthese);
      if (bVar2) {
        match((Token *)local_278,this,T_ExpressionParanthese);
        std::__cxx11::string::~string((string *)(local_278 + 8));
        pVVar5->Type = VNT_Expression;
        pEVar7 = gr_expression(this);
        (pVVar5->field_1)._Expression = pEVar7;
        match((Token *)local_2a0,this,T_CloseParanthese);
        this_01 = (string *)(local_2a0 + 8);
      }
      else {
        bVar2 = lookahead(this,T_Integer);
        if (bVar2) {
          match(&str,this,T_Integer);
          pVVar5->Type = VNT_Integer;
          std::__cxx11::istringstream::istringstream
                    ((istringstream *)&str_2,(string *)&str.Value,_S_in);
          std::istream::_M_extract<long>((long *)&str_2);
        }
        else {
          bVar2 = lookahead(this,T_Float);
          if (!bVar2) {
            bVar2 = lookahead(this,T_String);
            if (!bVar2) {
              bVar2 = lookahead(this,T_True);
              if (bVar2) {
                match((Token *)local_2c8,this,T_True);
                std::__cxx11::string::~string((string *)(local_2c8 + 8));
                pVVar5->Type = VNT_Boolean;
                (pVVar5->field_1)._Boolean = true;
                return pVVar5;
              }
              bVar2 = lookahead(this,T_False);
              if (bVar2) {
                match((Token *)local_2f0,this,T_False);
                std::__cxx11::string::~string((string *)(local_2f0 + 8));
                pVVar5->Type = VNT_Boolean;
                (pVVar5->field_1)._Boolean = false;
                return pVVar5;
              }
              pVVar5->Type = VNT_Unknown;
              std::__cxx11::stringstream::stringstream((stringstream *)&str_2);
              poVar8 = std::operator<<((ostream *)&str_2.Value._M_string_length,
                                       "INTERNAL: Unknown lookahead \'");
              this_00 = &this->mLexer;
              Lexer::look(&str,this_00);
              pcVar9 = tokenToString(str.Type);
              poVar8 = std::operator<<(poVar8,pcVar9);
              std::operator<<(poVar8,"\' for values.");
              std::__cxx11::string::~string((string *)&str.Value);
              pSVar1 = this->mLogger;
              lVar3 = Lexer::currentLine(this_00);
              cVar4 = Lexer::currentColumn(this_00);
              std::__cxx11::stringbuf::str();
              (*pSVar1->_vptr_SourceLogger[2])(pSVar1,(ulong)lVar3,(ulong)cVar4,4,&str);
              std::__cxx11::string::~string((string *)&str);
              std::__cxx11::stringstream::~stringstream((stringstream *)&str_2);
              return pVVar5;
            }
            match(&str_2,this,T_String);
            pVVar5->Type = VNT_String;
            this_01 = (string *)&str_2.Value;
            std::__cxx11::string::_M_assign((string *)&pVVar5->_String);
            goto LAB_0010ee0a;
          }
          match(&str,this,T_Float);
          pVVar5->Type = VNT_Float;
          std::__cxx11::istringstream::istringstream
                    ((istringstream *)&str_2,(string *)&str.Value,_S_in);
          std::istream::_M_extract<float>((float *)&str_2);
        }
        this_01 = (string *)&str.Value;
        std::__cxx11::istringstream::~istringstream((istringstream *)&str_2);
      }
    }
  }
LAB_0010ee0a:
  std::__cxx11::string::~string(this_01);
  return pVVar5;
}

Assistant:

ValueNode* Parser::gr_value()
{
	ValueNode* node = new ValueNode;

	if (lookahead(T_OpenParanthese)) {
		match(T_OpenParanthese);

		node->Type		 = VNT_Statement;
		node->_Statement = gr_statement();

		match(T_CloseParanthese);
	} else if (lookahead(T_OpenSquareBracket)) // Anonymous group
	{
		match(T_OpenSquareBracket);

		node->Type		 = VNT_Statement;
		node->_Statement = gr_array();

		match(T_CloseSquareBracket);
	} else if (lookahead(T_ExpressionParanthese)) {
		match(T_ExpressionParanthese);

		node->Type		  = VNT_Expression;
		node->_Expression = gr_expression();

		match(T_CloseParanthese);
	} else if (lookahead(T_Integer)) {
		Token str = match(T_Integer);

		node->Type = VNT_Integer;
		std::istringstream(str.Value) >> node->_Integer;
	} else if (lookahead(T_Float)) {
		Token str = match(T_Float);

		node->Type = VNT_Float;
		std::istringstream(str.Value) >> node->_Float;
	} else if (lookahead(T_String)) {
		Token str = match(T_String);

		node->Type	= VNT_String;
		node->_String = str.Value;
	} else if (lookahead(T_True)) {
		match(T_True);

		node->Type	 = VNT_Boolean;
		node->_Boolean = true;
	} else if (lookahead(T_False)) {
		match(T_False);

		node->Type	 = VNT_Boolean;
		node->_Boolean = false;
	} else {
		node->Type = VNT_Unknown;

		std::stringstream stream;
		stream << "INTERNAL: Unknown lookahead '" << tokenToString(mLexer.look().Type) << "' for values.";
		mLogger->log(mLexer.currentLine(), mLexer.currentColumn(), L_Fatal, stream.str());
	}

	return node;
}